

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_ToString_Test::TestBody
          (AckMessageTest_ToString_Test *this)

{
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  bidfx_public_api::price::pixie::AckMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[142],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"Ack(revision=1234567, revisionTime=20141104170641000, priceReceivedTime=20141104170641200, ackTime=20141104170641201, handlingDuration=666us)\""
             ,"ackMessage.ToString()",
             (char (*) [142])
             "Ack(revision=1234567, revisionTime=20141104170641000, priceReceivedTime=20141104170641200, ackTime=20141104170641201, handlingDuration=666us)"
             ,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(AckMessageTest, ToString)
{
    ASSERT_EQ(
            "Ack(revision=1234567, revisionTime=20141104170641000, priceReceivedTime=20141104170641200, ackTime=20141104170641201, handlingDuration=666us)",
            ackMessage.ToString());
}